

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timestamp_comparison.cpp
# Opt level: O3

void __thiscall
duckdb::TimeStampComparison::TimeStampComparison
          (TimeStampComparison *this,ClientContext *context,ExpressionRewriter *rewriter)

{
  _Head_base<0UL,_duckdb::ExpressionTypeMatcher_*,_false> _Var1;
  _Head_base<0UL,_duckdb::TypeMatcher_*,_false> _Var2;
  _Head_base<0UL,_duckdb::ExpressionMatcher_*,_false> _Var3;
  _Head_base<0UL,_duckdb::ComparisonExpressionMatcher_*,_false> _Var4;
  pointer pCVar5;
  _Head_base<0UL,_duckdb::ExpressionTypeMatcher_*,_false> _Var6;
  _Head_base<0UL,_duckdb::TypeMatcher_*,_false> _Var7;
  pointer pCVar8;
  _Head_base<0UL,_duckdb::ExpressionMatcher_*,_false> _Var9;
  pointer pEVar10;
  _Head_base<0UL,_duckdb::CastExpressionMatcher_*,_false> local_50;
  _Head_base<0UL,_duckdb::CastExpressionMatcher_*,_false> local_48;
  _Head_base<0UL,_duckdb::ComparisonExpressionMatcher_*,_false> local_40;
  _Head_base<0UL,_duckdb::ExpressionMatcher_*,_false> local_38;
  
  (this->super_Rule).rewriter = rewriter;
  (this->super_Rule).root.
  super_unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>_>._M_t.
  super___uniq_ptr_impl<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::ExpressionMatcher_*,_std::default_delete<duckdb::ExpressionMatcher>_>
  .super__Head_base<0UL,_duckdb::ExpressionMatcher_*,_false>._M_head_impl = (ExpressionMatcher *)0x0
  ;
  (this->super_Rule)._vptr_Rule = (_func_int **)&PTR__Rule_0197a9a0;
  this->context = context;
  local_40._M_head_impl = (ComparisonExpressionMatcher *)operator_new(0x40);
  ((local_40._M_head_impl)->super_ExpressionMatcher).expr_class = BOUND_COMPARISON;
  ((local_40._M_head_impl)->super_ExpressionMatcher).expr_type.
  super_unique_ptr<duckdb::ExpressionTypeMatcher,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::ExpressionTypeMatcher,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::ExpressionTypeMatcher_*,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
  .super__Head_base<0UL,_duckdb::ExpressionTypeMatcher_*,_false>._M_head_impl =
       (ExpressionTypeMatcher *)0x0;
  ((local_40._M_head_impl)->super_ExpressionMatcher).type.
  super_unique_ptr<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>_>._M_t.
  super___uniq_ptr_impl<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::TypeMatcher_*,_std::default_delete<duckdb::TypeMatcher>_>.
  super__Head_base<0UL,_duckdb::TypeMatcher_*,_false>._M_head_impl = (TypeMatcher *)0x0;
  ((local_40._M_head_impl)->super_ExpressionMatcher)._vptr_ExpressionMatcher =
       (_func_int **)&PTR__ComparisonExpressionMatcher_0199b1d8;
  ((local_40._M_head_impl)->matchers).
  super_vector<duckdb::unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ((local_40._M_head_impl)->matchers).
  super_vector<duckdb::unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ((local_40._M_head_impl)->matchers).
  super_vector<duckdb::unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (local_40._M_head_impl)->policy = INVALID;
  pCVar5 = unique_ptr<duckdb::ComparisonExpressionMatcher,_std::default_delete<duckdb::ComparisonExpressionMatcher>,_true>
           ::operator->((unique_ptr<duckdb::ComparisonExpressionMatcher,_std::default_delete<duckdb::ComparisonExpressionMatcher>,_true>
                         *)&local_40);
  pCVar5->policy = UNORDERED;
  _Var6._M_head_impl = (ExpressionTypeMatcher *)operator_new(0x10);
  (_Var6._M_head_impl)->_vptr_ExpressionTypeMatcher =
       (_func_int **)&PTR__ExpressionTypeMatcher_0197ad48;
  *(undefined1 *)&_Var6._M_head_impl[1]._vptr_ExpressionTypeMatcher = 0x19;
  pCVar5 = unique_ptr<duckdb::ComparisonExpressionMatcher,_std::default_delete<duckdb::ComparisonExpressionMatcher>,_true>
           ::operator->((unique_ptr<duckdb::ComparisonExpressionMatcher,_std::default_delete<duckdb::ComparisonExpressionMatcher>,_true>
                         *)&local_40);
  _Var1._M_head_impl =
       (pCVar5->super_ExpressionMatcher).expr_type.
       super_unique_ptr<duckdb::ExpressionTypeMatcher,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::ExpressionTypeMatcher,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ExpressionTypeMatcher_*,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
       .super__Head_base<0UL,_duckdb::ExpressionTypeMatcher_*,_false>._M_head_impl;
  (pCVar5->super_ExpressionMatcher).expr_type.
  super_unique_ptr<duckdb::ExpressionTypeMatcher,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::ExpressionTypeMatcher,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::ExpressionTypeMatcher_*,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
  .super__Head_base<0UL,_duckdb::ExpressionTypeMatcher_*,_false>._M_head_impl = _Var6._M_head_impl;
  if (_Var1._M_head_impl != (ExpressionTypeMatcher *)0x0) {
    (*(_Var1._M_head_impl)->_vptr_ExpressionTypeMatcher[1])();
  }
  local_48._M_head_impl = (CastExpressionMatcher *)operator_new(0x28);
  ((local_48._M_head_impl)->super_ExpressionMatcher).expr_class = BOUND_CAST;
  ((local_48._M_head_impl)->super_ExpressionMatcher).expr_type.
  super_unique_ptr<duckdb::ExpressionTypeMatcher,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::ExpressionTypeMatcher,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::ExpressionTypeMatcher_*,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
  .super__Head_base<0UL,_duckdb::ExpressionTypeMatcher_*,_false> =
       (_Head_base<0UL,_duckdb::ExpressionTypeMatcher_*,_false>)0x0;
  ((local_48._M_head_impl)->super_ExpressionMatcher).type.
  super_unique_ptr<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>_>._M_t.
  super___uniq_ptr_impl<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::TypeMatcher_*,_std::default_delete<duckdb::TypeMatcher>_>.
  super__Head_base<0UL,_duckdb::TypeMatcher_*,_false> =
       (_Head_base<0UL,_duckdb::TypeMatcher_*,_false>)0x0;
  ((local_48._M_head_impl)->super_ExpressionMatcher)._vptr_ExpressionMatcher =
       (_func_int **)&PTR__CastExpressionMatcher_0199b218;
  ((local_48._M_head_impl)->matcher).
  super_unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>_>._M_t.
  super___uniq_ptr_impl<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::ExpressionMatcher_*,_std::default_delete<duckdb::ExpressionMatcher>_>
  .super__Head_base<0UL,_duckdb::ExpressionMatcher_*,_false> =
       (_Head_base<0UL,_duckdb::ExpressionMatcher_*,_false>)0x0;
  _Var7._M_head_impl = (TypeMatcher *)operator_new(0x10);
  (_Var7._M_head_impl)->_vptr_TypeMatcher = (_func_int **)&PTR__TypeMatcher_0197ad98;
  *(undefined1 *)&_Var7._M_head_impl[1]._vptr_TypeMatcher = 0xf;
  pCVar8 = unique_ptr<duckdb::CastExpressionMatcher,_std::default_delete<duckdb::CastExpressionMatcher>,_true>
           ::operator->((unique_ptr<duckdb::CastExpressionMatcher,_std::default_delete<duckdb::CastExpressionMatcher>,_true>
                         *)&local_48);
  _Var2._M_head_impl =
       (pCVar8->super_ExpressionMatcher).type.
       super_unique_ptr<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>_>._M_t.
       super___uniq_ptr_impl<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::TypeMatcher_*,_std::default_delete<duckdb::TypeMatcher>_>.
       super__Head_base<0UL,_duckdb::TypeMatcher_*,_false>._M_head_impl;
  (pCVar8->super_ExpressionMatcher).type.
  super_unique_ptr<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>_>._M_t.
  super___uniq_ptr_impl<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::TypeMatcher_*,_std::default_delete<duckdb::TypeMatcher>_>.
  super__Head_base<0UL,_duckdb::TypeMatcher_*,_false>._M_head_impl = _Var7._M_head_impl;
  if (_Var2._M_head_impl != (TypeMatcher *)0x0) {
    (*(_Var2._M_head_impl)->_vptr_TypeMatcher[1])();
  }
  _Var9._M_head_impl = (ExpressionMatcher *)operator_new(0x20);
  (_Var9._M_head_impl)->_vptr_ExpressionMatcher = (_func_int **)&PTR__ExpressionMatcher_0199b120;
  (_Var9._M_head_impl)->expr_class = INVALID;
  ((_Var9._M_head_impl)->expr_type).
  super_unique_ptr<duckdb::ExpressionTypeMatcher,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
       = (unique_ptr<duckdb::ExpressionTypeMatcher,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
          )0x0;
  ((_Var9._M_head_impl)->type).
  super_unique_ptr<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>_> =
       (unique_ptr<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>_>)0x0;
  pCVar8 = unique_ptr<duckdb::CastExpressionMatcher,_std::default_delete<duckdb::CastExpressionMatcher>,_true>
           ::operator->((unique_ptr<duckdb::CastExpressionMatcher,_std::default_delete<duckdb::CastExpressionMatcher>,_true>
                         *)&local_48);
  _Var3._M_head_impl =
       (pCVar8->matcher).
       super_unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>_>.
       _M_t.
       super___uniq_ptr_impl<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ExpressionMatcher_*,_std::default_delete<duckdb::ExpressionMatcher>_>
       .super__Head_base<0UL,_duckdb::ExpressionMatcher_*,_false>._M_head_impl;
  (pCVar8->matcher).
  super_unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>_>._M_t.
  super___uniq_ptr_impl<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::ExpressionMatcher_*,_std::default_delete<duckdb::ExpressionMatcher>_>
  .super__Head_base<0UL,_duckdb::ExpressionMatcher_*,_false>._M_head_impl = _Var9._M_head_impl;
  if (_Var3._M_head_impl != (ExpressionMatcher *)0x0) {
    (**(code **)((long)(_Var3._M_head_impl)->_vptr_ExpressionMatcher + 8))();
  }
  pCVar8 = unique_ptr<duckdb::CastExpressionMatcher,_std::default_delete<duckdb::CastExpressionMatcher>,_true>
           ::operator->((unique_ptr<duckdb::CastExpressionMatcher,_std::default_delete<duckdb::CastExpressionMatcher>,_true>
                         *)&local_48);
  pEVar10 = unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>
            ::operator->(&pCVar8->matcher);
  pEVar10->expr_class = BOUND_COLUMN_REF;
  _Var7._M_head_impl = (TypeMatcher *)operator_new(0x10);
  (_Var7._M_head_impl)->_vptr_TypeMatcher = (_func_int **)&PTR__TypeMatcher_0197ad98;
  *(undefined1 *)&_Var7._M_head_impl[1]._vptr_TypeMatcher = 0x13;
  pCVar8 = unique_ptr<duckdb::CastExpressionMatcher,_std::default_delete<duckdb::CastExpressionMatcher>,_true>
           ::operator->((unique_ptr<duckdb::CastExpressionMatcher,_std::default_delete<duckdb::CastExpressionMatcher>,_true>
                         *)&local_48);
  pEVar10 = unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>
            ::operator->(&pCVar8->matcher);
  _Var2._M_head_impl =
       (pEVar10->type).
       super_unique_ptr<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>_>._M_t.
       super___uniq_ptr_impl<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::TypeMatcher_*,_std::default_delete<duckdb::TypeMatcher>_>.
       super__Head_base<0UL,_duckdb::TypeMatcher_*,_false>._M_head_impl;
  (pEVar10->type).super_unique_ptr<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>_>.
  _M_t.super___uniq_ptr_impl<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::TypeMatcher_*,_std::default_delete<duckdb::TypeMatcher>_>.
  super__Head_base<0UL,_duckdb::TypeMatcher_*,_false>._M_head_impl = _Var7._M_head_impl;
  if (_Var2._M_head_impl != (TypeMatcher *)0x0) {
    (*(_Var2._M_head_impl)->_vptr_TypeMatcher[1])();
  }
  pCVar5 = unique_ptr<duckdb::ComparisonExpressionMatcher,_std::default_delete<duckdb::ComparisonExpressionMatcher>,_true>
           ::operator->((unique_ptr<duckdb::ComparisonExpressionMatcher,_std::default_delete<duckdb::ComparisonExpressionMatcher>,_true>
                         *)&local_40);
  local_50._M_head_impl = local_48._M_head_impl;
  local_48._M_head_impl = (CastExpressionMatcher *)0x0;
  ::std::
  vector<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>,std::allocator<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>>>
  ::
  emplace_back<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>>
            ((vector<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>,std::allocator<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>>>
              *)&pCVar5->matchers,
             (unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>
              *)&local_50);
  if (local_50._M_head_impl != (CastExpressionMatcher *)0x0) {
    (*((local_50._M_head_impl)->super_ExpressionMatcher)._vptr_ExpressionMatcher[1])();
  }
  local_50._M_head_impl = (CastExpressionMatcher *)operator_new(0x28);
  ((local_50._M_head_impl)->super_ExpressionMatcher).expr_class = BOUND_CAST;
  ((local_50._M_head_impl)->super_ExpressionMatcher).expr_type.
  super_unique_ptr<duckdb::ExpressionTypeMatcher,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::ExpressionTypeMatcher,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::ExpressionTypeMatcher_*,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
  .super__Head_base<0UL,_duckdb::ExpressionTypeMatcher_*,_false> =
       (_Head_base<0UL,_duckdb::ExpressionTypeMatcher_*,_false>)0x0;
  ((local_50._M_head_impl)->super_ExpressionMatcher).type.
  super_unique_ptr<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>_>._M_t.
  super___uniq_ptr_impl<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::TypeMatcher_*,_std::default_delete<duckdb::TypeMatcher>_>.
  super__Head_base<0UL,_duckdb::TypeMatcher_*,_false> =
       (_Head_base<0UL,_duckdb::TypeMatcher_*,_false>)0x0;
  ((local_50._M_head_impl)->super_ExpressionMatcher)._vptr_ExpressionMatcher =
       (_func_int **)&PTR__CastExpressionMatcher_0199b218;
  ((local_50._M_head_impl)->matcher).
  super_unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>_>._M_t.
  super___uniq_ptr_impl<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::ExpressionMatcher_*,_std::default_delete<duckdb::ExpressionMatcher>_>
  .super__Head_base<0UL,_duckdb::ExpressionMatcher_*,_false> =
       (_Head_base<0UL,_duckdb::ExpressionMatcher_*,_false>)0x0;
  _Var7._M_head_impl = (TypeMatcher *)operator_new(0x10);
  (_Var7._M_head_impl)->_vptr_TypeMatcher = (_func_int **)&PTR__TypeMatcher_0197ad98;
  *(undefined1 *)&_Var7._M_head_impl[1]._vptr_TypeMatcher = 0xf;
  pCVar8 = unique_ptr<duckdb::CastExpressionMatcher,_std::default_delete<duckdb::CastExpressionMatcher>,_true>
           ::operator->((unique_ptr<duckdb::CastExpressionMatcher,_std::default_delete<duckdb::CastExpressionMatcher>,_true>
                         *)&local_50);
  _Var2._M_head_impl =
       (pCVar8->super_ExpressionMatcher).type.
       super_unique_ptr<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>_>._M_t.
       super___uniq_ptr_impl<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::TypeMatcher_*,_std::default_delete<duckdb::TypeMatcher>_>.
       super__Head_base<0UL,_duckdb::TypeMatcher_*,_false>._M_head_impl;
  (pCVar8->super_ExpressionMatcher).type.
  super_unique_ptr<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>_>._M_t.
  super___uniq_ptr_impl<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::TypeMatcher_*,_std::default_delete<duckdb::TypeMatcher>_>.
  super__Head_base<0UL,_duckdb::TypeMatcher_*,_false>._M_head_impl = _Var7._M_head_impl;
  if (_Var2._M_head_impl != (TypeMatcher *)0x0) {
    (*(_Var2._M_head_impl)->_vptr_TypeMatcher[1])();
  }
  _Var9._M_head_impl = (ExpressionMatcher *)operator_new(0x20);
  (_Var9._M_head_impl)->expr_class = INVALID;
  ((_Var9._M_head_impl)->expr_type).
  super_unique_ptr<duckdb::ExpressionTypeMatcher,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
       = (unique_ptr<duckdb::ExpressionTypeMatcher,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
          )0x0;
  ((_Var9._M_head_impl)->type).
  super_unique_ptr<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>_> =
       (unique_ptr<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>_>)0x0;
  (_Var9._M_head_impl)->_vptr_ExpressionMatcher = (_func_int **)&PTR__ExpressionMatcher_0199b358;
  pCVar8 = unique_ptr<duckdb::CastExpressionMatcher,_std::default_delete<duckdb::CastExpressionMatcher>,_true>
           ::operator->((unique_ptr<duckdb::CastExpressionMatcher,_std::default_delete<duckdb::CastExpressionMatcher>,_true>
                         *)&local_50);
  _Var3._M_head_impl =
       (pCVar8->matcher).
       super_unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>_>.
       _M_t.
       super___uniq_ptr_impl<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ExpressionMatcher_*,_std::default_delete<duckdb::ExpressionMatcher>_>
       .super__Head_base<0UL,_duckdb::ExpressionMatcher_*,_false>._M_head_impl;
  (pCVar8->matcher).
  super_unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>_>._M_t.
  super___uniq_ptr_impl<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::ExpressionMatcher_*,_std::default_delete<duckdb::ExpressionMatcher>_>
  .super__Head_base<0UL,_duckdb::ExpressionMatcher_*,_false>._M_head_impl = _Var9._M_head_impl;
  if (_Var3._M_head_impl != (ExpressionMatcher *)0x0) {
    (**(code **)((long)(_Var3._M_head_impl)->_vptr_ExpressionMatcher + 8))();
  }
  pCVar8 = unique_ptr<duckdb::CastExpressionMatcher,_std::default_delete<duckdb::CastExpressionMatcher>,_true>
           ::operator->((unique_ptr<duckdb::CastExpressionMatcher,_std::default_delete<duckdb::CastExpressionMatcher>,_true>
                         *)&local_50);
  pEVar10 = unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>
            ::operator->(&pCVar8->matcher);
  pEVar10->expr_class = BOUND_CONSTANT;
  _Var7._M_head_impl = (TypeMatcher *)operator_new(0x10);
  (_Var7._M_head_impl)->_vptr_TypeMatcher = (_func_int **)&PTR__TypeMatcher_0197ad98;
  *(undefined1 *)&_Var7._M_head_impl[1]._vptr_TypeMatcher = 0x19;
  pCVar8 = unique_ptr<duckdb::CastExpressionMatcher,_std::default_delete<duckdb::CastExpressionMatcher>,_true>
           ::operator->((unique_ptr<duckdb::CastExpressionMatcher,_std::default_delete<duckdb::CastExpressionMatcher>,_true>
                         *)&local_50);
  pEVar10 = unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>
            ::operator->(&pCVar8->matcher);
  _Var2._M_head_impl =
       (pEVar10->type).
       super_unique_ptr<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>_>._M_t.
       super___uniq_ptr_impl<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::TypeMatcher_*,_std::default_delete<duckdb::TypeMatcher>_>.
       super__Head_base<0UL,_duckdb::TypeMatcher_*,_false>._M_head_impl;
  (pEVar10->type).super_unique_ptr<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>_>.
  _M_t.super___uniq_ptr_impl<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::TypeMatcher_*,_std::default_delete<duckdb::TypeMatcher>_>.
  super__Head_base<0UL,_duckdb::TypeMatcher_*,_false>._M_head_impl = _Var7._M_head_impl;
  if (_Var2._M_head_impl != (TypeMatcher *)0x0) {
    (*(_Var2._M_head_impl)->_vptr_TypeMatcher[1])();
  }
  pCVar5 = unique_ptr<duckdb::ComparisonExpressionMatcher,_std::default_delete<duckdb::ComparisonExpressionMatcher>,_true>
           ::operator->((unique_ptr<duckdb::ComparisonExpressionMatcher,_std::default_delete<duckdb::ComparisonExpressionMatcher>,_true>
                         *)&local_40);
  local_38._M_head_impl = &(local_50._M_head_impl)->super_ExpressionMatcher;
  local_50._M_head_impl = (CastExpressionMatcher *)0x0;
  ::std::
  vector<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>,std::allocator<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>>>
  ::
  emplace_back<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>>
            ((vector<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>,std::allocator<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>>>
              *)&pCVar5->matchers,
             (unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>
              *)&local_38);
  if ((CastExpressionMatcher *)local_38._M_head_impl != (CastExpressionMatcher *)0x0) {
    (*((ExpressionMatcher *)&(local_38._M_head_impl)->_vptr_ExpressionMatcher)->
      _vptr_ExpressionMatcher[1])();
  }
  _Var4._M_head_impl = local_40._M_head_impl;
  local_40._M_head_impl = (ComparisonExpressionMatcher *)0x0;
  _Var3._M_head_impl =
       (this->super_Rule).root.
       super_unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>_>.
       _M_t.
       super___uniq_ptr_impl<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ExpressionMatcher_*,_std::default_delete<duckdb::ExpressionMatcher>_>
       .super__Head_base<0UL,_duckdb::ExpressionMatcher_*,_false>._M_head_impl;
  (this->super_Rule).root.
  super_unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>_>._M_t.
  super___uniq_ptr_impl<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::ExpressionMatcher_*,_std::default_delete<duckdb::ExpressionMatcher>_>
  .super__Head_base<0UL,_duckdb::ExpressionMatcher_*,_false>._M_head_impl =
       &(_Var4._M_head_impl)->super_ExpressionMatcher;
  if (_Var3._M_head_impl != (ExpressionMatcher *)0x0) {
    (**(code **)((long)(_Var3._M_head_impl)->_vptr_ExpressionMatcher + 8))();
  }
  if (local_50._M_head_impl != (CastExpressionMatcher *)0x0) {
    (*((local_50._M_head_impl)->super_ExpressionMatcher)._vptr_ExpressionMatcher[1])();
  }
  if (local_48._M_head_impl != (CastExpressionMatcher *)0x0) {
    (*((local_48._M_head_impl)->super_ExpressionMatcher)._vptr_ExpressionMatcher[1])();
  }
  if (local_40._M_head_impl != (ComparisonExpressionMatcher *)0x0) {
    (*((local_40._M_head_impl)->super_ExpressionMatcher)._vptr_ExpressionMatcher[1])();
  }
  return;
}

Assistant:

TimeStampComparison::TimeStampComparison(ClientContext &context, ExpressionRewriter &rewriter)
    : Rule(rewriter), context(context) {
	// match on a ComparisonExpression that is an Equality and has a VARCHAR and ENUM as its children
	auto op = make_uniq<ComparisonExpressionMatcher>();
	op->policy = SetMatcher::Policy::UNORDERED;
	// Enum requires expression to be root
	op->expr_type = make_uniq<SpecificExpressionTypeMatcher>(ExpressionType::COMPARE_EQUAL);

	// one side is timestamp cast to date
	auto left = make_uniq<CastExpressionMatcher>();
	left->type = make_uniq<TypeMatcherId>(LogicalTypeId::DATE);
	left->matcher = make_uniq<ExpressionMatcher>();
	left->matcher->expr_class = ExpressionClass::BOUND_COLUMN_REF;
	left->matcher->type = make_uniq<TypeMatcherId>(LogicalTypeId::TIMESTAMP);
	op->matchers.push_back(std::move(left));

	// other side is varchar to date?
	auto right = make_uniq<CastExpressionMatcher>();
	right->type = make_uniq<TypeMatcherId>(LogicalTypeId::DATE);
	right->matcher = make_uniq<FoldableConstantMatcher>();
	right->matcher->expr_class = ExpressionClass::BOUND_CONSTANT;
	right->matcher->type = make_uniq<TypeMatcherId>(LogicalTypeId::VARCHAR);
	op->matchers.push_back(std::move(right));

	root = std::move(op);
}